

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstorage.c
# Opt level: O0

void * internal_find_add(storage_blocks *sb,string_struct *r,uint8_t prev_bytes,char *s,int doadd)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  void *a;
  void *pvVar8;
  byte *pbVar9;
  char *in_RCX;
  byte in_DL;
  storage_blocks *in_RSI;
  long *in_RDI;
  int in_R8D;
  char *newcurrent;
  uchar sz_p1;
  int res;
  size_t mid;
  char *newvalue;
  size_t len;
  uint8_t common_bytes;
  size_t end;
  size_t begin;
  size_t in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  byte local_41;
  ulong local_40;
  ulong uVar10;
  undefined4 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  void *local_8;
  
  uVar10 = 0;
  local_41 = 0;
  uVar4 = in_RSI->used_bytes;
  while( true ) {
    local_40 = uVar4;
    if (local_40 <= uVar10) {
      if (uVar10 != 0) {
        sVar5 = get_common_prefix_size
                          (in_RCX,(char *)(*(long *)(in_RSI->current + (uVar10 - 1) * 0x18) +
                                           *in_RDI + 1));
        local_41 = (byte)sVar5;
      }
      if (local_41 < 9) {
        if (in_R8D == 0) {
          local_8 = (void *)0x0;
        }
        else {
          pcVar6 = (char *)allocate_reallocate_array
                                     (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0x1016aa);
          in_RSI->current = pcVar6;
          if (in_RSI->current == (char *)0x0) {
            local_8 = (void *)0x0;
          }
          else {
            if (uVar10 != in_RSI->used_bytes) {
              memmove(in_RSI->current + (uVar10 + 1) * 0x18,in_RSI->current + uVar10 * 0x18,
                      (in_RSI->used_bytes - uVar10) * 0x18);
            }
            sVar7 = strlen(in_RCX);
            sVar7 = sVar7 + 1;
            if ((in_RDI[2] == 0) || (0x1000 < in_RDI[1] + 1 + sVar7 + *in_RDI)) {
              a = calloc(1,0x1000);
              pvVar8 = allocate_reallocate_array(a,in_stack_ffffffffffffff88,0x101797);
              in_RDI[4] = (long)pvVar8;
              if (in_RDI[4] == 0) {
                return (void *)0x0;
              }
              lVar2 = in_RDI[3];
              in_RDI[3] = lVar2 + 1;
              *(void **)(in_RDI[4] + lVar2 * 8) = a;
              in_RDI[2] = (long)a;
              in_RDI[1] = 0;
            }
            pbVar9 = (byte *)(in_RDI[2] + in_RDI[1]);
            *(byte **)(in_RSI->current + uVar10 * 0x18) = pbVar9;
            pcVar6 = in_RSI->current + uVar10 * 0x18 + 8;
            pcVar6[0] = '\0';
            pcVar6[1] = '\0';
            pcVar6[2] = '\0';
            pcVar6[3] = '\0';
            pcVar6[4] = '\0';
            pcVar6[5] = '\0';
            pcVar6[6] = '\0';
            pcVar6[7] = '\0';
            pcVar6 = in_RSI->current + uVar10 * 0x18 + 0x10;
            pcVar6[0] = '\0';
            pcVar6[1] = '\0';
            pcVar6[2] = '\0';
            pcVar6[3] = '\0';
            pcVar6[4] = '\0';
            pcVar6[5] = '\0';
            pcVar6[6] = '\0';
            pcVar6[7] = '\0';
            *pbVar9 = in_DL;
            memcpy(pbVar9 + *in_RDI + 1,in_RCX,sVar7);
            in_RDI[1] = *in_RDI + 1 + sVar7 + in_RDI[1];
            in_RSI->used_bytes = in_RSI->used_bytes + 1;
            local_8 = (void *)(*(long *)(in_RSI->current + uVar10 * 0x18) + 1);
          }
        }
      }
      else {
        local_8 = internal_find_add(in_RSI,(string_struct *)
                                           CONCAT17(in_DL,in_stack_ffffffffffffffe0),
                                    (uint8_t)((ulong)in_RCX >> 0x38),
                                    (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                                    (int)(uVar10 >> 0x20));
      }
      return local_8;
    }
    uVar4 = uVar10 + local_40 >> 1;
    iVar3 = strcmp(in_RCX,(char *)(*(long *)(in_RSI->current + uVar4 * 0x18) + *in_RDI + 1));
    bVar1 = **(byte **)(in_RSI->current + uVar4 * 0x18);
    if ((iVar3 == 0) && (bVar1 == in_DL)) break;
    if (bVar1 == in_DL) {
      if (-1 < iVar3) {
        uVar10 = uVar4 + 1;
        uVar4 = local_40;
      }
    }
    else if (in_DL <= bVar1) {
      uVar10 = uVar4 + 1;
      uVar4 = local_40;
    }
  }
  return (void *)(*(long *)(in_RSI->current + uVar4 * 0x18) + 1);
}

Assistant:

void *internal_find_add(storage_blocks *sb, struct string_struct *r, uint8_t prev_bytes, const char *s, int doadd)
{
	size_t begin = 0;
	size_t end = r->child_count;
	uint8_t common_bytes = 0;
	size_t len;
	char *newvalue;

	while (begin < end)
	{
		size_t mid = (begin + end) >> 1;
		int res = strcmp(s, r->children[mid].value + sb->user_data_size + 1);
		unsigned char sz_p1 = *(r->children[mid].value);
		if ((res == 0) && (sz_p1 == prev_bytes))
		{
			return (void*)(r->children[mid].value + 1);
		}
		else if (sz_p1 == prev_bytes)
		{
			if (res < 0) end = mid; else begin = mid + 1;
		}
		else
		{
			if (sz_p1 < prev_bytes) end = mid; else begin = mid + 1;
		}
	}

	/* 2. check how many bytes common with previous string */
	if (begin != 0) common_bytes = get_common_prefix_size(s, r->children[begin - 1].value + sb->user_data_size + 1);

	if (common_bytes > 8)
	{
		return internal_find_add(sb, &r->children[begin - 1], prev_bytes + common_bytes, s + common_bytes, doadd);
	}

	if (doadd == 0) return 0;

	/* 3. insert string after begin */
	r->children = allocate_reallocate_array(r->children, r->child_count, sizeof(struct string_struct));
	if (r->children == 0) return 0;
	if (begin != r->child_count)
	{
		memmove(&r->children[begin + 1], &r->children[begin],
		  (r->child_count - begin) * sizeof(struct string_struct));
	}

	len = strlen(s) + 1;
	if ((sb->current == 0) || (sb->used_bytes + 1 + len + sb->user_data_size > STORAGE_BLOCK_SIZE))
	{
		char *newcurrent = (char*)calloc(1, STORAGE_BLOCK_SIZE);
		sb->blocks = allocate_reallocate_array(sb->blocks, sb->block_count, sizeof(char*));
		if (sb->blocks == 0) return 0;

		sb->blocks[sb->block_count++] = newcurrent;
		sb->current = newcurrent;
		sb->used_bytes = 0;
	}

	newvalue = sb->current + sb->used_bytes;
	r->children[begin].value = newvalue;
	r->children[begin].child_count = 0;
	r->children[begin].children = 0;
	*(uint8_t*)(newvalue) = prev_bytes;
	memcpy(newvalue + sb->user_data_size + 1, s, len);
	sb->used_bytes += sb->user_data_size + 1 + len;
	r->child_count++;
	return (void*)(r->children[begin].value + 1);
}